

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar uVar4;
  float *pfVar5;
  int iVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  int iVar11;
  uchar *puVar12;
  uint uVar13;
  int iVar14;
  
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      iVar2 = stride + this->w * -3;
      iVar1 = this->h;
      iVar6 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar6 = this->h;
      }
      if (0 < iVar1) {
        iVar6 = iVar6 * this->w;
        lVar8 = this->elemsize * this->cstep;
        pfVar7 = (float *)this->data;
        pfVar5 = (float *)((long)pfVar7 + lVar8 * 2);
        pfVar9 = (float *)(lVar8 + (long)pfVar7);
        iVar11 = 0;
        iVar14 = 0;
        puVar12 = pixels;
        do {
          uVar13 = iVar6 + 1;
          if (0 < iVar6) {
            do {
              iVar3 = (int)*pfVar7;
              if ((int)*pfVar7 < 1) {
                iVar3 = iVar11;
              }
              if (0xfe < iVar3) {
                iVar3 = 0xff;
              }
              *puVar12 = (uchar)iVar3;
              iVar3 = (int)*pfVar9;
              if ((int)*pfVar9 < 1) {
                iVar3 = iVar11;
              }
              if (0xfe < iVar3) {
                iVar3 = 0xff;
              }
              puVar12[1] = (uchar)iVar3;
              iVar3 = (int)*pfVar5;
              if ((int)*pfVar5 < 1) {
                iVar3 = iVar11;
              }
              if (0xfe < iVar3) {
                iVar3 = 0xff;
              }
              puVar12[2] = (uchar)iVar3;
              puVar12 = puVar12 + 3;
              pfVar7 = pfVar7 + 1;
              pfVar9 = pfVar9 + 1;
              pfVar5 = pfVar5 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          puVar12 = puVar12 + iVar2;
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar1);
      }
    }
    if ((short)type == 4) {
      iVar2 = stride + this->w * -4;
      iVar1 = this->h;
      iVar6 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar6 = this->h;
      }
      if (0 < iVar1) {
        iVar6 = iVar6 * this->w;
        pfVar7 = (float *)this->data;
        lVar8 = this->elemsize * this->cstep;
        pfVar9 = (float *)(lVar8 * 3 + (long)pfVar7);
        pfVar5 = (float *)((long)pfVar7 + lVar8 * 2);
        pfVar10 = (float *)(lVar8 + (long)pfVar7);
        iVar11 = 0;
        do {
          uVar13 = iVar6 + 1;
          if (0 < iVar6) {
            do {
              iVar14 = (int)*pfVar7;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              *pixels = (uchar)iVar14;
              iVar14 = (int)*pfVar10;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              pixels[1] = (uchar)iVar14;
              iVar14 = (int)*pfVar5;
              if ((int)*pfVar5 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              pixels[2] = (uchar)iVar14;
              iVar14 = (int)*pfVar9;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              pixels[3] = (uchar)iVar14;
              pixels = pixels + 4;
              pfVar7 = pfVar7 + 1;
              pfVar10 = pfVar10 + 1;
              pfVar5 = pfVar5 + 1;
              pfVar9 = pfVar9 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar2;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar1);
      }
    }
    else if ((type & 0xffffU) == 3) {
      iVar2 = stride - this->w;
      iVar1 = this->h;
      iVar6 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar6 = this->h;
      }
      if (0 < iVar1) {
        iVar6 = iVar6 * this->w;
        pfVar5 = (float *)this->data;
        iVar11 = 0;
        do {
          uVar13 = iVar6 + 1;
          if (0 < iVar6) {
            do {
              iVar14 = (int)*pfVar5;
              if ((int)*pfVar5 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              *pixels = (uchar)iVar14;
              pixels = pixels + 1;
              pfVar5 = pfVar5 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar2;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar1);
      }
    }
  }
  else if (type < 0x40001) {
    if ((type == 0x10002) || (type == 0x20001)) {
      iVar2 = stride + this->w * -3;
      iVar1 = this->h;
      iVar6 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar6 = this->h;
      }
      if (0 < iVar1) {
        iVar6 = iVar6 * this->w;
        pfVar7 = (float *)this->data;
        lVar8 = this->elemsize * this->cstep;
        pfVar5 = (float *)((long)pfVar7 + lVar8 * 2);
        pfVar9 = (float *)(lVar8 + (long)pfVar7);
        iVar11 = 0;
        do {
          uVar13 = iVar6 + 1;
          if (0 < iVar6) {
            do {
              iVar14 = (int)*pfVar7;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              pixels[2] = (uchar)iVar14;
              iVar14 = (int)*pfVar9;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              pixels[1] = (uchar)iVar14;
              iVar14 = (int)*pfVar5;
              if ((int)*pfVar5 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              *pixels = (uchar)iVar14;
              pixels = pixels + 3;
              pfVar7 = pfVar7 + 1;
              pfVar9 = pfVar9 + 1;
              pfVar5 = pfVar5 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar2;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar1);
      }
    }
  }
  else if (type == 0x40001) {
    iVar2 = stride + this->w * -4;
    iVar1 = this->h;
    iVar6 = 1;
    if (iVar2 == 0) {
      iVar1 = 1;
      iVar6 = this->h;
    }
    if (0 < iVar1) {
      iVar6 = iVar6 * this->w;
      pfVar7 = (float *)this->data;
      lVar8 = this->elemsize * this->cstep;
      pfVar5 = (float *)((long)pfVar7 + lVar8 * 2);
      pfVar9 = (float *)(lVar8 + (long)pfVar7);
      iVar11 = 0;
      do {
        uVar13 = iVar6 + 1;
        if (0 < iVar6) {
          do {
            iVar14 = (int)*pfVar7;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            *pixels = (uchar)iVar14;
            iVar14 = (int)*pfVar9;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pixels[1] = (uchar)iVar14;
            iVar14 = (int)*pfVar5;
            if ((int)*pfVar5 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pixels[2] = (uchar)iVar14;
            pixels[3] = 0xff;
            pixels = pixels + 4;
            pfVar7 = pfVar7 + 1;
            pfVar9 = pfVar9 + 1;
            pfVar5 = pfVar5 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
        pixels = pixels + iVar2;
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar1);
    }
  }
  else if (type == 0x40002) {
    iVar2 = stride + this->w * -4;
    iVar1 = this->h;
    iVar6 = 1;
    if (iVar2 == 0) {
      iVar1 = 1;
      iVar6 = this->h;
    }
    if (0 < iVar1) {
      iVar6 = iVar6 * this->w;
      pfVar7 = (float *)this->data;
      lVar8 = this->elemsize * this->cstep;
      pfVar5 = (float *)((long)pfVar7 + lVar8 * 2);
      pfVar9 = (float *)(lVar8 + (long)pfVar7);
      iVar11 = 0;
      do {
        uVar13 = iVar6 + 1;
        if (0 < iVar6) {
          do {
            iVar14 = (int)*pfVar5;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            *pixels = (uchar)iVar14;
            iVar14 = (int)*pfVar9;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pixels[1] = (uchar)iVar14;
            iVar14 = (int)*pfVar7;
            if ((int)*pfVar7 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pixels[2] = (uchar)iVar14;
            pixels[3] = 0xff;
            pixels = pixels + 4;
            pfVar7 = pfVar7 + 1;
            pfVar9 = pfVar9 + 1;
            pfVar5 = pfVar5 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
        pixels = pixels + iVar2;
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar1);
    }
  }
  else if (type == 0x40003) {
    iVar2 = stride + this->w * -4;
    iVar1 = 1;
    iVar6 = this->h;
    if (iVar2 == 0) {
      iVar1 = this->h;
      iVar6 = 1;
    }
    if (0 < iVar6) {
      iVar1 = iVar1 * this->w;
      pfVar5 = (float *)this->data;
      iVar11 = 0;
      do {
        uVar13 = iVar1 + 1;
        if (0 < iVar1) {
          do {
            iVar14 = (int)*pfVar5;
            if ((int)*pfVar5 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            uVar4 = (uchar)iVar14;
            *pixels = uVar4;
            pixels[1] = uVar4;
            pixels[2] = uVar4;
            pixels[3] = 0xff;
            pixels = pixels + 4;
            pfVar5 = pfVar5 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
        pixels = pixels + iVar2;
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar6);
    }
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
            to_gray2rgba(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA)
            to_rgba(*this, pixels, stride);
    }
}